

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void addWhereTerm(Parse *pParse,SrcList *pSrc,int iLeft,int iColLeft,int iRight,int iColRight,
                 int isOuterJoin,Expr **ppWhere)

{
  Parse *pParse_00;
  sqlite3 *db_00;
  Expr *pEVar1;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Expr *pEq;
  Expr *pE2;
  Expr *pE1;
  sqlite3 *db;
  Expr *in_stack_ffffffffffffffb8;
  Expr *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  SrcList *pSrc_00;
  
  pSrc_00 = (SrcList *)*in_RDI;
  pParse_00 = (Parse *)sqlite3CreateColumnExpr
                                 ((sqlite3 *)CONCAT44(in_R8D,in_R9D),pSrc_00,
                                  (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                  (int)in_stack_ffffffffffffffd0);
  db_00 = (sqlite3 *)
          sqlite3CreateColumnExpr
                    ((sqlite3 *)CONCAT44(in_R8D,in_R9D),pSrc_00,(int)((ulong)pParse_00 >> 0x20),
                     (int)pParse_00);
  pEVar1 = sqlite3PExpr(pParse_00,(int)((ulong)db_00 >> 0x20),in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8);
  if ((pEVar1 != (Expr *)0x0) && ((int)pEq != 0)) {
    pEVar1->flags = pEVar1->flags | 1;
    pEVar1->iRightJoinTable = (i16)db_00->mDbFlags;
  }
  pEVar1 = sqlite3ExprAnd(db_00,pEVar1,in_stack_ffffffffffffffb8);
  *(Expr **)pE2 = pEVar1;
  return;
}

Assistant:

static void addWhereTerm(
  Parse *pParse,                  /* Parsing context */
  SrcList *pSrc,                  /* List of tables in FROM clause */
  int iLeft,                      /* Index of first table to join in pSrc */
  int iColLeft,                   /* Index of column in first table */
  int iRight,                     /* Index of second table in pSrc */
  int iColRight,                  /* Index of column in second table */
  int isOuterJoin,                /* True if this is an OUTER join */
  Expr **ppWhere                  /* IN/OUT: The WHERE clause to add to */
){
  sqlite3 *db = pParse->db;
  Expr *pE1;
  Expr *pE2;
  Expr *pEq;

  assert( iLeft<iRight );
  assert( pSrc->nSrc>iRight );
  assert( pSrc->a[iLeft].pTab );
  assert( pSrc->a[iRight].pTab );

  pE1 = sqlite3CreateColumnExpr(db, pSrc, iLeft, iColLeft);
  pE2 = sqlite3CreateColumnExpr(db, pSrc, iRight, iColRight);

  pEq = sqlite3PExpr(pParse, TK_EQ, pE1, pE2);
  if( pEq && isOuterJoin ){
    ExprSetProperty(pEq, EP_FromJoin);
    assert( !ExprHasProperty(pEq, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(pEq, EP_NoReduce);
    pEq->iRightJoinTable = (i16)pE2->iTable;
  }
  *ppWhere = sqlite3ExprAnd(db, *ppWhere, pEq);
}